

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

_Bool player_set_timed(player *p,wchar_t idx,wchar_t v,_Bool notify,_Bool can_disturb)

{
  effect *peVar1;
  _Bool _Var2;
  source origin;
  source sVar3;
  wchar_t local_7c;
  anon_enum_32 local_78;
  anon_union_8_4_b62eeb40_for_which_conflict local_70;
  _Bool local_61;
  anon_enum_32 local_60;
  _Bool ident_1;
  anon_union_8_4_b62eeb40_for_which_conflict local_58;
  _Bool local_49;
  object *poStack_48;
  _Bool ident;
  object *weapon;
  timed_grade *current_grade;
  timed_grade *new_grade;
  timed_effect_data *effect;
  wchar_t local_20;
  _Bool can_disturb_local;
  wchar_t wStack_1c;
  _Bool notify_local;
  wchar_t v_local;
  wchar_t idx_local;
  player *p_local;
  
  effect._6_1_ = can_disturb;
  effect._7_1_ = notify;
  local_20 = v;
  wStack_1c = idx;
  _v_local = p;
  if (idx < L'\0') {
    __assert_fail("idx >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                  ,0x316,"_Bool player_set_timed(struct player *, int, int, _Bool, _Bool)");
  }
  if (L'4' < idx) {
    __assert_fail("idx < TMD_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                  ,0x317,"_Bool player_set_timed(struct player *, int, int, _Bool, _Bool)");
  }
  new_grade = (timed_grade *)(timed_effects + idx);
  current_grade = timed_effects[idx].grade;
  weapon = (object *)timed_effects[idx].grade;
  poStack_48 = equipped_item_by_slot_name(p,"weapon");
  if (local_20 < *(wchar_t *)((long)&new_grade[1].next + 4)) {
    local_7c = *(wchar_t *)((long)&new_grade[1].next + 4);
  }
  else {
    local_7c = local_20;
  }
  local_20 = local_7c;
  if (_v_local->timed[wStack_1c] == local_7c) {
    p_local._7_1_ = false;
  }
  else {
    do {
      if (local_7c <= current_grade->max) break;
      current_grade = current_grade->next;
    } while (current_grade->next != (timed_grade *)0x0);
    do {
      if ((int)_v_local->timed[wStack_1c] <= *(int *)&weapon->ego) break;
      weapon = weapon->known;
    } while (weapon->known != (object *)0x0);
    if (current_grade->max < local_7c) {
      if ((int)_v_local->timed[wStack_1c] == current_grade->max) {
        return false;
      }
      local_20 = current_grade->max;
    }
    if (((timed_effects[wStack_1c].temp_resist != -1) &&
        (_v_local->obj_k->el_info[timed_effects[wStack_1c].temp_resist].res_level != 0)) &&
       (_Var2 = player_is_immune(_v_local,timed_effects[wStack_1c].temp_resist), _Var2)) {
      effect._7_1_ = 0;
    }
    if ((((timed_effects[wStack_1c].oflag_syn & 1U) != 0) &&
        (timed_effects[wStack_1c].oflag_dup != 0)) &&
       ((_Var2 = flag_has_dbg(_v_local->obj_k->flags,5,timed_effects[wStack_1c].oflag_dup,
                              "p->obj_k->flags","timed_effects[idx].oflag_dup"), _Var2 &&
        (_Var2 = player_of_has_not_timed(_v_local,timed_effects[wStack_1c].oflag_dup), _Var2)))) {
      effect._7_1_ = 0;
    }
    if (*(int *)&weapon->kind < current_grade->grade) {
      print_custom_message(poStack_48,current_grade->up_msg,new_grade[1].grade,_v_local);
      effect._7_1_ = 1;
    }
    else if ((current_grade->grade < *(int *)&weapon->kind) &&
            (current_grade->down_msg != (char *)0x0)) {
      print_custom_message(poStack_48,current_grade->down_msg,new_grade[1].grade,_v_local);
      effect._7_1_ = 1;
    }
    else if ((effect._7_1_ & 1) != 0) {
      if (local_20 == L'\0') {
        print_custom_message(poStack_48,new_grade->up_msg,L'5',_v_local);
      }
      else if ((local_20 < _v_local->timed[wStack_1c]) && (new_grade->next != (timed_grade *)0x0)) {
        print_custom_message(poStack_48,(char *)new_grade->next,new_grade[1].grade,_v_local);
      }
      else if ((_v_local->timed[wStack_1c] < local_20) && (new_grade->down_msg != (char *)0x0)) {
        print_custom_message(poStack_48,new_grade->down_msg,new_grade[1].grade,_v_local);
      }
    }
    if ((local_20 < L'\x01') || (_v_local->timed[wStack_1c] != 0)) {
      if ((local_20 == L'\0') && (new_grade[1].down_msg != (char *)0x0)) {
        local_61 = false;
        peVar1 = (effect *)new_grade[1].down_msg;
        if ((effect._6_1_ & 1) == 0) {
          sVar3 = source_player();
          local_70 = sVar3.which;
          local_78 = sVar3.what;
        }
        else {
          sVar3 = source_none();
          local_70 = sVar3.which;
          local_78 = sVar3.what;
        }
        sVar3._4_4_ = 0;
        sVar3.what = local_78;
        sVar3.which.trap = local_70.trap;
        effect_do(peVar1,sVar3,(object *)0x0,&local_61,true,L'\0',L'\0',L'\0',
                  (command_conflict *)0x0);
      }
    }
    else if (new_grade[1].up_msg != (char *)0x0) {
      local_49 = false;
      peVar1 = (effect *)new_grade[1].up_msg;
      if ((effect._6_1_ & 1) == 0) {
        sVar3 = source_player();
        local_58 = sVar3.which;
        local_60 = sVar3.what;
      }
      else {
        sVar3 = source_none();
        local_58 = sVar3.which;
        local_60 = sVar3.what;
      }
      origin._4_4_ = 0;
      origin.what = local_60;
      origin.which.trap = local_58.trap;
      effect_do(peVar1,origin,(object *)0x0,&local_49,true,L'\0',L'\0',L'\0',(command_conflict *)0x0
               );
    }
    _v_local->timed[wStack_1c] = (int16_t)local_20;
    if ((effect._7_1_ & 1) != 0) {
      if ((effect._6_1_ & 1) != 0) {
        disturb(_v_local);
      }
      _v_local->upkeep->update = *(uint *)&new_grade->field_0xc | _v_local->upkeep->update;
      _v_local->upkeep->redraw = _v_local->upkeep->redraw | new_grade->max | 0x2000U;
      handle_stuff(_v_local);
    }
    p_local._7_1_ = (_Bool)(effect._7_1_ & 1);
  }
  return p_local._7_1_;
}

Assistant:

bool player_set_timed(struct player *p, int idx, int v, bool notify,
		bool can_disturb)
{
	assert(idx >= 0);
	assert(idx < TMD_MAX);

	struct timed_effect_data *effect = &timed_effects[idx];
	struct timed_grade *new_grade = effect->grade;
	struct timed_grade *current_grade = effect->grade;
	struct object *weapon = equipped_item_by_slot_name(p, "weapon");

	/* Lower bound */
	v = MAX(v, effect->lower_bound);

	/* No change */
	if (p->timed[idx] == v) {
		return false;
	}

	/* Find the grade we will be going to, and the current one */
	while (v > new_grade->max) {
		new_grade = new_grade->next;
		if (!new_grade->next) break;
	}
	while (p->timed[idx] > current_grade->max) {
		current_grade = current_grade->next;
		if (!current_grade->next) break;
	}

	/* Upper bound */
	if (v > new_grade->max) {
		if (p->timed[idx] == new_grade->max) {
			/*
			 * No change:  tried to exceed the maximum possible and
			 * already there
			 */
			return false;
		}
		v = new_grade->max;
	}

	/* Don't mention effects which already match the known player state. */
	if (timed_effects[idx].temp_resist != -1 &&
			p->obj_k->el_info[timed_effects[idx].temp_resist].res_level &&
			player_is_immune(p, timed_effects[idx].temp_resist)) {
		notify = false;
	}
	if (timed_effects[idx].oflag_syn &&
			timed_effects[idx].oflag_dup != OF_NONE &&
			of_has(p->obj_k->flags, timed_effects[idx].oflag_dup) &&
			player_of_has_not_timed(p, timed_effects[idx].oflag_dup)) {
		notify = false;
	}

	/* Always mention going up a grade, otherwise on request */
	if (new_grade->grade > current_grade->grade) {
		print_custom_message(weapon, new_grade->up_msg,
			effect->msgt, p);
		notify = true;
	} else if ((new_grade->grade < current_grade->grade) &&
			(new_grade->down_msg)) {
		print_custom_message(weapon, new_grade->down_msg,
			effect->msgt, p);
		notify = true;
	} else if (notify) {
		if (v == 0) {
			/* Finishing */
			print_custom_message(weapon, effect->on_end,
				MSG_RECOVER, p);
		} else if (p->timed[idx] > v && effect->on_decrease) {
			/* Decrementing */
			print_custom_message(weapon, effect->on_decrease,
				effect->msgt, p);
		} else if (v > p->timed[idx] && effect->on_increase) {
			/* Incrementing */
			print_custom_message(weapon, effect->on_increase,
				effect->msgt, p);
		}
	}

	/*
	 * Dispatch effects for transitions.  Use source_player() as the
	 * origin if can_disturb is not true; otherwise, use source_none().
	 * That way any TIMED_INC or TIMED_INC_NO_RES effects in the effect
	 * chains will honor can_disturb.
	 */
	if (v > 0 && !p->timed[idx]) {
		/* The effect starts. */
		if (effect->on_begin_effect) {
			bool ident = false;

			(void) effect_do(effect->on_begin_effect,
				can_disturb ? source_none() : source_player(),
				NULL, &ident, true, 0, 0, 0, NULL);
		}
	} else if (v == 0) {
		/* The effect lapses. */
		if (effect->on_end_effect) {
			bool ident = false;

			(void) effect_do(effect->on_end_effect,
				can_disturb ? source_none() : source_player(),
				NULL, &ident, true, 0, 0, 0, NULL);
		}
	}

	/* Use the value */
	p->timed[idx] = v;

	if (notify) {
		/* Disturb */
		if (can_disturb) {
			disturb(p);
		}

		/* Update the visuals, as appropriate. */
		p->upkeep->update |= effect->flag_update;
		p->upkeep->redraw |= (PR_STATUS | effect->flag_redraw);

		/* Handle stuff */
		handle_stuff(p);
	}

	return notify;
}